

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSeqCleanup(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint fVeryVerbose;
  uint fVerbose;
  uint nFramesSymb;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  undefined4 extraout_var;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_48;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_5c = 0;
  Extra_UtilGetoptReset();
  local_48 = 0x200;
  nFramesSymb = 1;
  local_68 = 1;
  fVerbose = 0;
  fVeryVerbose = 0;
  local_64 = local_68;
  local_60 = local_68;
LAB_00206c51:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"cenmFSvwh");
    iVar4 = globalUtilOptind;
    if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_00206daa:
        Abc_Print(-1,pcVar5);
        goto LAB_00206db4;
      }
      nFramesSymb = atoi(argv[globalUtilOptind]);
      uVar2 = nFramesSymb;
    }
    else {
      if (iVar1 != 0x53) {
        if (iVar1 == 99) {
          local_68 = local_68 ^ 1;
        }
        else if (iVar1 == 0x65) {
          local_64 = local_64 ^ 1;
        }
        else if (iVar1 == 0x6d) {
          local_5c = local_5c ^ 1;
        }
        else if (iVar1 == 0x6e) {
          local_60 = local_60 ^ 1;
        }
        else if (iVar1 == 0x76) {
          fVerbose = fVerbose ^ 1;
        }
        else {
          if (iVar1 != 0x77) {
            if (iVar1 == -1) {
              if (pAVar3 == (Abc_Ntk_t *)0x0) {
                pcVar5 = "Empty network.\n";
              }
              else if (pAVar3->ntkType == ABC_NTK_STRASH) {
                if (pAVar3->nObjCounts[8] == 0) {
                  Abc_Print(-1,"The network is combinational.\n");
                  return 0;
                }
                pAVar3 = Abc_NtkDarLatchSweep
                                   (pAVar3,local_68,local_64,local_60,local_5c,nFramesSymb,
                                    (int)local_48,fVerbose,fVeryVerbose);
                if (pAVar3 != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                  return 0;
                }
                pcVar5 = "Sequential cleanup has failed.\n";
              }
              else {
                pcVar5 = "Only works for structrally hashed networks.\n";
              }
              iVar4 = -1;
              goto LAB_00206ecd;
            }
            goto LAB_00206db4;
          }
          fVeryVerbose = fVeryVerbose ^ 1;
        }
        goto LAB_00206c51;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00206daa;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_48 = CONCAT44(extraout_var,uVar2);
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_00206db4:
      iVar4 = -2;
      Abc_Print(-2,"usage: scleanup [-cenmFSvwh]\n");
      Abc_Print(-2,"\t         performs sequential cleanup of the current network\n");
      Abc_Print(-2,"\t         by removing nodes and latches that do not feed into POs\n");
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_68 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (local_64 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_60 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle preserving latch names [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_5c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n",
                pcVar5);
      Abc_Print(-2,"\t-F num : the number of first frames simulated symbolically [default = %d]\n",
                (ulong)nFramesSymb);
      Abc_Print(-2,
                "\t-S num : the number of frames when symbolic saturation begins [default = %d]\n",
                local_48);
      pcVar5 = "yes";
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar5);
      if (fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle very verbose output [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_00206ecd:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSeqCleanup( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fLatchConst  =   1;
    int fLatchEqual  =   1;
    int fSaveNames   =   1;
    int fUseMvSweep  =   0;
    int nFramesSymb  =   1;
    int nFramesSatur = 512;
    int fVerbose     =   0;
    int fVeryVerbose =   0;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cenmFSvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fLatchConst ^= 1;
            break;
        case 'e':
            fLatchEqual ^= 1;
            break;
        case 'n':
            fSaveNames ^= 1;
            break;
        case 'm':
            fUseMvSweep ^= 1;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSymb = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSymb < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesSatur = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesSatur < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarLatchSweep( pNtk, fLatchConst, fLatchEqual, fSaveNames, fUseMvSweep, nFramesSymb, nFramesSatur, fVerbose, fVeryVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential cleanup has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: scleanup [-cenmFSvwh]\n" );
    Abc_Print( -2, "\t         performs sequential cleanup of the current network\n" );
    Abc_Print( -2, "\t         by removing nodes and latches that do not feed into POs\n" );
    Abc_Print( -2, "\t-c     : sweep stuck-at latches detected by ternary simulation [default = %s]\n", fLatchConst? "yes": "no" );
    Abc_Print( -2, "\t-e     : merge equal latches (same data inputs and init states) [default = %s]\n", fLatchEqual? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle preserving latch names [default = %s]\n", fSaveNames? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using hybrid ternary/symbolic simulation [default = %s]\n", fUseMvSweep? "yes": "no" );
    Abc_Print( -2, "\t-F num : the number of first frames simulated symbolically [default = %d]\n", nFramesSymb );
    Abc_Print( -2, "\t-S num : the number of frames when symbolic saturation begins [default = %d]\n", nFramesSatur );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle very verbose output [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}